

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O1

void dump_regs(int cnum,FILE *outf,uint32_t *ref_val,int ref_exist,uint32_t reg,uint32_t regs_len,
              color color)

{
  char *pcVar1;
  undefined4 in_register_00000084;
  char *pcVar2;
  int i;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  uint32_t local_74;
  int local_70;
  uint32_t local_6c;
  uint local_68;
  uint32_t local_64;
  undefined8 local_60;
  uint32_t *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_60 = CONCAT44(in_register_00000084,reg);
  if (regs_len != 0) {
    local_40 = (long)cnum;
    local_48 = (ulong)reg;
    local_50 = (ulong)regs_len;
    uVar4 = 0;
    local_70 = ref_exist;
    local_58 = ref_val;
    do {
      local_68 = (uint)uVar4 & 0xc;
      if ((uVar4 & 0xc) == 0) {
        fprintf((FILE *)outf,"%08x: ",(ulong)((uint)uVar4 + (int)local_60));
      }
      local_6c = *(uint32_t *)((long)nva_cards[local_40]->bar0 + local_48 + uVar4);
      local_64 = local_58[uVar4];
      local_74 = local_6c;
      lVar3 = 3;
      local_38 = uVar4;
      do {
        if ((color == NO_COLOR) ||
           (*(char *)((long)&local_64 + lVar3) == *(char *)((long)&local_74 + lVar3))) {
          bVar5 = true;
          pcVar1 = (char *)0x0;
        }
        else {
          bVar5 = false;
          pcVar1 = "\x1b[0;31m";
        }
        if (bVar5) {
          pcVar1 = "";
        }
        pcVar2 = "\x1b[0m";
        if (bVar5) {
          pcVar2 = "";
        }
        fprintf((FILE *)outf,"%s%02x%s",pcVar1,(ulong)*(byte *)((long)&local_74 + lVar3),pcVar2);
        bVar5 = lVar3 != 0;
        lVar3 = lVar3 + -1;
      } while (bVar5);
      fputc(0x20,(FILE *)outf);
      uVar4 = local_38;
      if (local_70 == 0) {
        local_58[local_38] = local_6c;
      }
      if (local_68 == 0xc) {
        fputc(10,(FILE *)outf);
      }
      uVar4 = uVar4 + 4;
    } while (uVar4 < local_50);
  }
  return;
}

Assistant:

static void
dump_regs(int cnum, FILE* outf, uint32_t ref_val[], int ref_exist, uint32_t reg, uint32_t regs_len, enum color color)
{
	uint32_t val;
	int r;

	for (r = 0; r < regs_len; r+=4)
        {
                if (r % 0x10 == 0)
                        fprintf(outf, "%08x: ", reg + r);

                val = nva_rd32(cnum, reg + r);

                print_reg_diff(outf, ref_val[r], val, color);

                /* if the value wasn't initialized before, store it as a reference */
                if (ref_exist == 0)
                        ref_val[r] = val;

                if (r % 0x10 == 0xc)
                        fprintf(outf, "\n");
        }
}